

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O3

void higan::Logger::SetLogToConsole(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  bool bVar1;
  
  bVar1 = g_log_file.super___shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0;
  if (bVar1) {
    this._M_pi = g_log_file.super___shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
    bVar1 = g_log_file.super___shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    g_log_file.super___shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2> =
         (__shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2>)ZEXT816(0);
    if (bVar1) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
      return;
    }
  }
  return;
}

Assistant:

void Logger::SetLogToConsole()
{
	if (g_log_file)
	{
		g_log_file.reset();
	}
}